

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O3

void __thiscall adios2::core::engine::ssc::SscWriterGeneric::SyncReadPattern(SscWriterGeneric *this)

{
  BlockVecVec *output;
  RankPosMap *allOverlapRanks;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  ulong uVar6;
  __buckets_ptr pp_Var7;
  SscWriterGeneric *this_00;
  int iVar8;
  uint __len;
  uint __val;
  string __str;
  undefined1 local_a8 [56];
  Buffer globalBuffer;
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Engine","");
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"SscWriter","");
  globalBuffer.m_Capacity = (size_t)&globalBuffer.m_Buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&globalBuffer,"SyncReadPattern","");
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  iVar1 = (this->super_SscWriterBase).m_WriterRank;
  iVar2 = (this->super_SscWriterBase).m_Verbosity;
  iVar8 = 0;
  if (9 < iVar2) {
    iVar8 = iVar1;
  }
  adios2::helper::Log((string *)local_a8,(string *)&__str,(string *)&globalBuffer,
                      (string *)&local_50,iVar8,iVar1,5,iVar2,INFO);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if ((uint8_t **)globalBuffer.m_Capacity != &globalBuffer.m_Buffer) {
    operator_delete((void *)globalBuffer.m_Capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_);
  }
  globalBuffer.m_Buffer = (uint8_t *)malloc(1);
  globalBuffer.m_Capacity = 1;
  globalBuffer.m_Size = 0;
  BroadcastMetadata(&globalBuffer,(this->super_SscWriterBase).m_ReaderMasterStreamRank,
                    (this->super_SscWriterBase).m_StreamComm);
  this->m_ReaderSelectionsLocked = globalBuffer.m_Buffer[1] != '\0';
  output = &this->m_GlobalReadPattern;
  Deserialize(&globalBuffer,output,(this->super_SscWriterBase).m_IO,false,false,false,
              &this->m_StructDefinitions);
  CalculateOverlap((RankPosMap *)local_a8,output,
                   (this->m_GlobalWritePattern).
                   super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (this->super_SscWriterBase).m_StreamRank);
  allOverlapRanks = &this->m_AllSendingReaderRanks;
  std::
  _Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&allOverlapRanks->_M_h,local_a8);
  this_00 = (SscWriterGeneric *)local_a8;
  std::
  _Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this_00);
  CalculatePosition(this_00,&this->m_GlobalWritePattern,output,
                    (this->super_SscWriterBase).m_WriterRank,allOverlapRanks);
  if (9 < (this->super_SscWriterBase).m_Verbosity) {
    if (0 < (this->super_SscWriterBase).m_WriterSize) {
      __val = 0;
      do {
        MPI_Barrier((this->super_SscWriterBase).m_WriterComm);
        if (__val == (this->super_SscWriterBase).m_WriterRank) {
          __len = 1;
          if (9 < __val) {
            uVar6 = (ulong)__val;
            uVar3 = 4;
            do {
              __len = uVar3;
              uVar4 = (uint)uVar6;
              if (uVar4 < 100) {
                __len = __len - 2;
                goto LAB_0013f094;
              }
              if (uVar4 < 1000) {
                __len = __len - 1;
                goto LAB_0013f094;
              }
              if (uVar4 < 10000) goto LAB_0013f094;
              uVar6 = uVar6 / 10000;
              uVar3 = __len + 4;
            } while (99999 < uVar4);
            __len = __len + 1;
          }
LAB_0013f094:
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>(__str._M_dataplus._M_p,__len,__val);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x154c16);
          pp_Var7 = (__buckets_ptr)(plVar5 + 2);
          if ((__buckets_ptr)*plVar5 == pp_Var7) {
            local_a8._16_8_ = *pp_Var7;
            local_a8._24_8_ = plVar5[3];
            local_a8._0_8_ = local_a8 + 0x10;
          }
          else {
            local_a8._16_8_ = *pp_Var7;
            local_a8._0_8_ = (__buckets_ptr)*plVar5;
          }
          local_a8._8_8_ = plVar5[1];
          *plVar5 = (long)pp_Var7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          PrintRankPosMap(allOverlapRanks,(string *)local_a8);
          if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
            operator_delete((void *)local_a8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
        }
        __val = __val + 1;
      } while ((int)__val < (this->super_SscWriterBase).m_WriterSize);
    }
    MPI_Barrier((this->super_SscWriterBase).m_WriterComm);
  }
  if (globalBuffer.m_Buffer != (uint8_t *)0x0) {
    free(globalBuffer.m_Buffer);
  }
  return;
}

Assistant:

void SscWriterGeneric::SyncReadPattern()
{

    helper::Log("Engine", "SscWriter", "SyncReadPattern", "", m_Verbosity >= 10 ? m_WriterRank : 0,
                m_WriterRank, 5, m_Verbosity, helper::LogMode::INFO);

    ssc::Buffer globalBuffer;

    ssc::BroadcastMetadata(globalBuffer, m_ReaderMasterStreamRank, m_StreamComm);

    m_ReaderSelectionsLocked = globalBuffer[1];

    ssc::Deserialize(globalBuffer, m_GlobalReadPattern, m_IO, false, false, false,
                     m_StructDefinitions);
    m_AllSendingReaderRanks =
        ssc::CalculateOverlap(m_GlobalReadPattern, m_GlobalWritePattern[m_StreamRank]);
    CalculatePosition(m_GlobalWritePattern, m_GlobalReadPattern, m_WriterRank,
                      m_AllSendingReaderRanks);

    if (m_Verbosity >= 10)
    {
        for (int i = 0; i < m_WriterSize; ++i)
        {
            MPI_Barrier(m_WriterComm);
            if (i == m_WriterRank)
            {
                ssc::PrintRankPosMap(m_AllSendingReaderRanks,
                                     "Rank Pos Map for Writer " + std::to_string(m_WriterRank));
            }
        }
        MPI_Barrier(m_WriterComm);
    }
}